

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

EncFrmStatus * get_ref_from_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  uint uVar1;
  int iVar2;
  uint local_64;
  char *local_58;
  EncVirtualCpb *local_38;
  EncFrmStatus *ref;
  RK_S32 ref_arg;
  MppEncRefMode ref_mode;
  EncFrmStatus *frm_local;
  EncVirtualCpb *cpb_local;
  
  uVar1 = (uint)(frm->val >> 0x10) & 0x3f;
  iVar2 = (int)(char)((frm->val << 0x22) >> 0x38);
  if ((frm->val >> 5 & 1) == 0) {
    local_38 = (EncVirtualCpb *)0x0;
    switch(uVar1) {
    case 0:
    case 1:
    case 2:
    case 3:
      local_38 = (EncVirtualCpb *)(cpb->mode_refs + uVar1);
      break;
    case 4:
      local_38 = (EncVirtualCpb *)(cpb->st_tid_refs + iVar2);
      break;
    case 5:
      local_38 = (EncVirtualCpb *)(cpb->lt_idx_refs + iVar2);
      break;
    case 6:
      local_38 = (EncVirtualCpb *)(cpb->cpb_refs + iVar2);
      break;
    case 0x19:
    default:
      _mpp_log_l(2,"mpp_enc_refs","frm %d not supported ref mode 0x%x\n","get_ref_from_cpb",
                 frm->val >> 0x30,(ulong)uVar1);
    }
    if (local_38 == (EncVirtualCpb *)0x0) {
      local_38 = (EncVirtualCpb *)0x0;
    }
    else if ((((EncFrmStatus *)&local_38->info)->val & 1) == 0) {
      _mpp_log_l(2,"mpp_enc_refs","frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                 "get_ref_from_cpb",frm->val >> 0x30,(ulong)uVar1,iVar2,
                 (uint)(ushort)(((EncFrmStatus *)&local_38->info)->val >> 0x30));
    }
    else if ((enc_refs_debug & 2) != 0) {
      if ((((EncFrmStatus *)&local_38->info)->val >> 7 & 1) == 0) {
        local_58 = "st";
      }
      else {
        local_58 = "lt";
      }
      if ((((EncFrmStatus *)&local_38->info)->val >> 7 & 1) == 0) {
        local_64 = 0;
      }
      else {
        local_64 = (uint)(((EncFrmStatus *)&local_38->info)->val >> 8) & 0xf;
      }
      _mpp_log_l(4,"mpp_enc_refs","frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                 "get_ref_from_cpb",frm->val >> 0x30,(ulong)uVar1,iVar2,
                 (uint)(ushort)(((EncFrmStatus *)&local_38->info)->val >> 0x30),local_58,local_64);
    }
    cpb_local = local_38;
  }
  else {
    cpb_local = (EncVirtualCpb *)0x0;
  }
  return (EncFrmStatus *)cpb_local;
}

Assistant:

static EncFrmStatus *get_ref_from_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    MppEncRefMode ref_mode = frm->ref_mode;
    RK_S32 ref_arg = frm->ref_arg;

    if (frm->is_idr)
        return NULL;

    EncFrmStatus *ref = NULL;

    /* step 3.1 find seq_idx by mode and arg */
    switch (ref_mode) {
    case REF_TO_PREV_REF_FRM :
    case REF_TO_PREV_ST_REF :
    case REF_TO_PREV_LT_REF :
    case REF_TO_PREV_INTRA : {
        ref = &cpb->mode_refs[ref_mode];
    } break;
    case REF_TO_TEMPORAL_LAYER : {
        ref = &cpb->st_tid_refs[ref_arg];
    } break;
    case REF_TO_LT_REF_IDX : {
        ref = &cpb->lt_idx_refs[ref_arg];
    } break;
    case REF_TO_ST_PREV_N_REF : {
        ref = &cpb->cpb_refs[ref_arg];
    } break;
    case REF_TO_ST_REF_SETUP :
    default : {
        mpp_err_f("frm %d not supported ref mode 0x%x\n", frm->seq_idx, ref_mode);
    } break;
    }

    if (ref) {
        if (ref->valid)
            enc_refs_dbg_flow("frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                              frm->seq_idx, ref_mode, ref_arg, ref->seq_idx,
                              ref->is_lt_ref ? "lt" : "st",
                              ref->is_lt_ref ? ref->lt_idx : 0);
        else
            mpp_err_f("frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                      frm->seq_idx, ref_mode, ref_arg, ref->seq_idx);
    } else {
        ref = NULL;
    }

    return ref;
}